

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

bool __thiscall
c4::basic_substring<const_char>::begins_with(basic_substring<const_char> *this,char c,size_t num)

{
  char *pcVar1;
  size_t sVar2;
  bool bVar3;
  
  if (this->len < num) {
    return false;
  }
  sVar2 = 0;
  do {
    bVar3 = num == sVar2;
    if (bVar3) {
      return bVar3;
    }
    pcVar1 = this->str + sVar2;
    sVar2 = sVar2 + 1;
  } while (*pcVar1 == c);
  return bVar3;
}

Assistant:

bool begins_with(const C c, size_t num) const
    {
        if(len < num)
        {
            return false;
        }
        for(size_t i = 0; i < num; ++i)
        {
            if(str[i] != c)
            {
                return false;
            }
        }
        return true;
    }